

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.h
# Opt level: O0

void __thiscall
Signal<const_cluster_head_msg_&>::emit(Signal<const_cluster_head_msg_&> *this,cluster_head_msg *p)

{
  bool bVar1;
  reference ppVar2;
  undefined1 local_58 [8];
  pair<const_int,_std::function<void_(const_cluster_head_msg_&)>_> it;
  iterator __end0;
  iterator __begin0;
  map<int,_std::function<void_(const_cluster_head_msg_&)>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(const_cluster_head_msg_&)>_>_>_>
  *__range2;
  cluster_head_msg *p_local;
  Signal<const_cluster_head_msg_&> *this_local;
  
  __end0 = std::
           map<int,_std::function<void_(const_cluster_head_msg_&)>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(const_cluster_head_msg_&)>_>_>_>
           ::begin(&this->slots_);
  it.second._M_invoker =
       (_Invoker_type)
       std::
       map<int,_std::function<void_(const_cluster_head_msg_&)>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(const_cluster_head_msg_&)>_>_>_>
       ::end(&this->slots_);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&it.second._M_invoker);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::function<void_(const_cluster_head_msg_&)>_>_>
             ::operator*(&__end0);
    std::pair<const_int,_std::function<void_(const_cluster_head_msg_&)>_>::pair
              ((pair<const_int,_std::function<void_(const_cluster_head_msg_&)>_> *)local_58,ppVar2);
    std::function<void_(const_cluster_head_msg_&)>::operator()
              ((function<void_(const_cluster_head_msg_&)> *)&it,p);
    std::pair<const_int,_std::function<void_(const_cluster_head_msg_&)>_>::~pair
              ((pair<const_int,_std::function<void_(const_cluster_head_msg_&)>_> *)local_58);
    std::_Rb_tree_iterator<std::pair<const_int,_std::function<void_(const_cluster_head_msg_&)>_>_>::
    operator++(&__end0);
  }
  return;
}

Assistant:

void emit(Args... p) {
    for(auto it : slots_) {
      it.second(p...);
    }
  }